

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  value_type vVar3;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  key_type *in_stack_fffffffffffffbe8;
  int index;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  unsigned_long *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  key_type in_stack_fffffffffffffc04;
  key_equal *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  value_type in_stack_fffffffffffffc14;
  char *in_stack_fffffffffffffc18;
  Type type;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  uint i_00;
  AssertHelper *in_stack_fffffffffffffc68;
  AssertionResult local_368 [6];
  value_type local_2fc;
  size_type local_2e8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffd28;
  key_type in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int iVar4;
  AssertionResult local_2b0 [6];
  value_type local_248;
  int local_244;
  size_type local_230;
  AssertionResult local_228;
  key_type local_214;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_210 [13];
  int local_138;
  int local_134;
  AssertionResult local_130 [6];
  value_type local_c8;
  key_type local_c4;
  int local_c0;
  int local_bc;
  size_type local_98;
  AssertionResult local_90 [6];
  value_type local_24;
  int local_20;
  key_type local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (float)((ulong)in_stack_fffffffffffffbe8 >> 0x20),SUB84(in_stack_fffffffffffffbe8,0));
  local_1c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                    in_stack_fffffffffffffbe8);
  for (local_20 = 0; local_20 < 0x333; local_20 = local_20 + 1) {
    in_stack_fffffffffffffc68 = in_RDI + 2;
    local_24 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (value_type *)in_stack_fffffffffffffd28._M_head_impl);
  }
  local_98 = google::
             BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x101e4fe);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    testing::AssertionResult::failure_message((AssertionResult *)0x101e565);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x101e5c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101e633);
  local_bc = google::
             BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::num_table_copies((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0x101e644);
  for (local_c0 = 0; local_c0 < 0x400; local_c0 = local_c0 + 1) {
    local_c4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
            in_stack_fffffffffffffbe8);
    local_c8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (value_type *)in_stack_fffffffffffffd28._M_head_impl);
  }
  local_134 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::num_table_copies((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0x101e716);
  local_138 = local_bc + 2;
  testing::internal::CmpHelperLT<int,int>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (int *)in_stack_fffffffffffffbf8,
             (int *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    testing::AssertionResult::failure_message((AssertionResult *)0x101e78d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x101e7ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101e85b);
  i_00 = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_210,i_00,(int *)(ulong)i_00);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffffc20),(size_type)in_stack_fffffffffffffc18,
             (hasher *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc08,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_210);
  kVar2 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  local_214 = kVar2;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                    in_stack_fffffffffffffbe8);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (float)((ulong)in_stack_fffffffffffffbe8 >> 0x20),SUB84(in_stack_fffffffffffffbe8,0));
  local_230 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x101e937);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(i_00,kVar2));
    in_stack_fffffffffffffc18 =
         testing::AssertionResult::failure_message((AssertionResult *)0x101e9f1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,kVar2),(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20)
               ,(char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x101ea4e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101eabf);
  for (local_244 = 0; local_244 < 0x333; local_244 = local_244 + 1) {
    in_stack_fffffffffffffc14 =
         HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
    local_248 = in_stack_fffffffffffffc14;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (value_type *)in_stack_fffffffffffffd28._M_head_impl);
  }
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x101eb51);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(i_00,kVar2));
    in_stack_fffffffffffffc08 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0x101ebba);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,kVar2),(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20)
               ,(char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x101ec17);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101ec88);
  iVar4 = 0;
  while( true ) {
    type = (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    index = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
    if (0x332 < iVar4) break;
    in_stack_fffffffffffffc04 =
         HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),index);
    in_stack_fffffffffffffd30 = in_stack_fffffffffffffc04;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
            in_stack_fffffffffffffbe8);
    local_2e8 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0x101ecef);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd20);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(i_00,kVar2));
      in_stack_fffffffffffffbf8 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0x101ed6a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(i_00,kVar2),
                 (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      testing::Message::~Message((Message *)0x101edc7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x101ee32);
    iVar4 = iVar4 + 1;
  }
  vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),index);
  local_2fc = vVar3;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(iVar4,in_stack_fffffffffffffd30),
           (value_type *)in_stack_fffffffffffffd28._M_head_impl);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x101eea9);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8,(unsigned_long *)CONCAT44(vVar3,in_stack_fffffffffffffbf0));
  iVar4 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(i_00,kVar2));
    testing::AssertionResult::failure_message((AssertionResult *)0x101ef12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,kVar2),type,
               (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    testing::internal::AssertHelper::operator=(in_RDI,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(vVar3,in_stack_fffffffffffffbf0));
    testing::Message::~Message((Message *)0x101ef6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101efd8);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x101efe5);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}